

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void set_done(vw *all)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x3458) = 1;
  lock_done((parser *)0x25d6dd);
  return;
}

Assistant:

void set_done(vw& all)
{
  all.early_terminate = true;
  lock_done(*all.p);
}